

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::setCurrentPath(QFileSystemEntry *path)

{
  long lVar1;
  int iVar2;
  char *__path;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  int r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::nativeFilePath(in_RDI);
  __path = QByteArray::constData((QByteArray *)0x6a197f);
  iVar2 = chdir(__path);
  QByteArray::~QByteArray((QByteArray *)0x6a1994);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return -1 < iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setCurrentPath(const QFileSystemEntry &path)
{
    int r;
    r = QT_CHDIR(path.nativeFilePath().constData());
    return r >= 0;
}